

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O0

void __thiscall flow::IRProgram::~IRProgram(IRProgram *this)

{
  bool bVar1;
  reference puVar2;
  const_iterator local_48;
  __normal_iterator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_*,_std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  local_40 [2];
  unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *local_30;
  unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *local_28;
  __normal_iterator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_*,_std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  local_20;
  __normal_iterator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_*,_std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  gh;
  unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> global;
  IRProgram *this_local;
  
  std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>::
  unique_ptr<std::default_delete<flow::IRHandler>,void>
            ((unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>> *)&gh);
  local_28 = (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)
             std::
             vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
             ::begin(&this->handlers_);
  local_30 = (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)
             std::
             vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
             ::end(&this->handlers_);
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>*,std::vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>>,flow::IRProgram::~IRProgram()::__0>
                       (local_28,local_30);
  local_40[0]._M_current =
       (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)
       std::
       vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
       ::end(&this->handlers_);
  bVar1 = __gnu_cxx::operator!=(&local_20,local_40);
  if (bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_*,_std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
             ::operator*(&local_20);
    std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>::operator=
              ((unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)&gh,puVar2);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>const*,std::vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>>
    ::__normal_iterator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>*>
              ((__normal_iterator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>const*,std::vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>>
                *)&local_48,&local_20);
    std::
    vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
    ::erase(&this->handlers_,local_48);
  }
  std::
  vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
  ::clear(&this->handlers_);
  std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>::reset
            ((unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)&gh,(pointer)0x0)
  ;
  std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>::~unique_ptr
            ((unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)&gh);
  std::vector<flow::ConstantArray,_std::allocator<flow::ConstantArray>_>::clear
            (&this->constantArrays_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
  ::clear(&this->numbers_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
  ::clear(&this->strings_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>_>_>
  ::clear(&this->ipaddrs_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
  ::clear(&this->cidrs_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
  ::clear(&this->builtinHandlers_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
  ::clear(&this->builtinFunctions_);
  std::
  vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
  ::~vector(&this->handlers_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
  ::~vector(&this->builtinHandlers_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
  ::~vector(&this->builtinFunctions_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
  ::~vector(&this->regexps_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
  ::~vector(&this->cidrs_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>_>_>
  ::~vector(&this->ipaddrs_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
  ::~vector(&this->strings_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
  ::~vector(&this->numbers_);
  std::vector<flow::ConstantArray,_std::allocator<flow::ConstantArray>_>::~vector
            (&this->constantArrays_);
  ConstantValue<bool,_(flow::LiteralType)1>::~ConstantValue(&this->falseLiteral_);
  ConstantValue<bool,_(flow::LiteralType)1>::~ConstantValue(&this->trueLiteral_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->modules_);
  return;
}

Assistant:

IRProgram::~IRProgram() {
  // first reset all standard handlers and *then* the global-scope initialization handler
  // in order to not cause confusion upon resource release
  {
    std::unique_ptr<IRHandler> global;
    auto gh = std::find_if(handlers_.begin(), handlers_.end(), [](auto& handler) {
        return handler->name() == GLOBAL_SCOPE_INIT_NAME;
    });
    if (gh != handlers_.end()) {
      global = std::move(*gh);
      handlers_.erase(gh);
    }
    handlers_.clear();
    global.reset(nullptr);
  }

  constantArrays_.clear();
  numbers_.clear();
  strings_.clear();
  ipaddrs_.clear();
  cidrs_.clear();
  builtinHandlers_.clear();
  builtinFunctions_.clear();
}